

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_generator_load(secp256k1_ge *ge,secp256k1_generator *gen)

{
  int succeed;
  secp256k1_generator *gen_local;
  secp256k1_ge *ge_local;
  
  secp256k1_fe_set_b32(&ge->x,gen->data);
  secp256k1_fe_set_b32(&ge->y,gen->data + 0x20);
  ge->infinity = 0;
  return;
}

Assistant:

static void secp256k1_generator_load(secp256k1_ge* ge, const secp256k1_generator* gen) {
    int succeed;
    succeed = secp256k1_fe_set_b32(&ge->x, &gen->data[0]);
    VERIFY_CHECK(succeed != 0);
    succeed = secp256k1_fe_set_b32(&ge->y, &gen->data[32]);
    VERIFY_CHECK(succeed != 0);
    ge->infinity = 0;
    (void) succeed;
}